

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O0

shared_ptr<cppnet::BufferQueue> __thiscall
cppnet::AlloterWrap::
PoolNewSharePtr<cppnet::BufferQueue,std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&>
          (AlloterWrap *this,shared_ptr<cppnet::BlockMemoryPool> *args,
          shared_ptr<cppnet::AlloterWrap> *args_1)

{
  BufferQueue *__p;
  shared_ptr<cppnet::AlloterWrap> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cppnet::BufferQueue> sVar1;
  BufferQueue *ret;
  shared_ptr<cppnet::AlloterWrap> *args_local_1;
  shared_ptr<cppnet::BlockMemoryPool> *args_local;
  AlloterWrap *this_local;
  
  __p = PoolNew<cppnet::BufferQueue,std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&>
                  ((AlloterWrap *)args,(shared_ptr<cppnet::BlockMemoryPool> *)args_1,in_RCX);
  std::shared_ptr<cppnet::BufferQueue>::
  shared_ptr<cppnet::BufferQueue,cppnet::AlloterWrap::PoolNewSharePtr<cppnet::BufferQueue,std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&>(std::shared_ptr<cppnet::BlockMemoryPool>&,std::shared_ptr<cppnet::AlloterWrap>&)::_lambda(cppnet::BufferQueue*)_1_,void>
            ((shared_ptr<cppnet::BufferQueue> *)this,__p,(anon_class_8_1_8991fb9c_for__M_tp)args);
  sVar1.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppnet::BufferQueue>)
         sVar1.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> AlloterWrap::PoolNewSharePtr(Args&&... args) {
    T* ret = PoolNew<T>(std::forward<Args>(args)...);
    return std::shared_ptr<T>(ret, [this](T* c) { PoolDelete(c); });
}